

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O1

void __thiscall bioparser::test::BioparserMhapTest::Check(BioparserMhapTest *this)

{
  pointer puVar1;
  MhapOverlap *pMVar2;
  undefined8 *puVar3;
  pointer puVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  undefined8 *local_18;
  
  local_28.data_._0_4_ = 0x96;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_20,"150","o.size()",(int *)&local_28,(unsigned_long *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/mhap_parser_test.cpp"
               ,0x34,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar3 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar3);
  }
  local_30._M_head_impl._0_4_ = 0x7745d4;
  puVar4 = (this->o).
           super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->o).
           super__Vector_base<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 == puVar1) {
    local_28.data_._0_4_ = 0;
  }
  else {
    local_28.data_._0_4_ = 0;
    do {
      pMVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>
               ._M_t.
               super__Tuple_impl<0UL,_bioparser::test::MhapOverlap_*,_std::default_delete<bioparser::test::MhapOverlap>_>
               .super__Head_base<0UL,_bioparser::test::MhapOverlap_*,_false>._M_head_impl;
      local_28.data_._0_4_ =
           (uint)(pMVar2->super_Overlap).strand +
           (int)local_28.data_ + (pMVar2->super_Overlap).lhs_id + (pMVar2->super_Overlap).lhs_begin
           + (pMVar2->super_Overlap).lhs_end + pMVar2->lhs_len + (pMVar2->super_Overlap).rhs_id +
           (pMVar2->super_Overlap).rhs_begin + (pMVar2->super_Overlap).rhs_end + pMVar2->rhs_len +
           (pMVar2->super_Overlap).score + pMVar2->error;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"7816660",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<MhapOverlap>& it) { return s + it->lhs_id + it->lhs_begin + it->lhs_end + it->lhs_len + it->rhs_id + it->rhs_begin + it->rhs_end + it->rhs_len + it->score + it->strand + it->error; })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/mhap_parser_test.cpp"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(150, o.size());
    EXPECT_EQ(7816660, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<MhapOverlap>& it) {
          return s +
              it->lhs_id + it->lhs_begin + it->lhs_end + it->lhs_len +
              it->rhs_id + it->rhs_begin + it->rhs_end + it->rhs_len +
              it->score +
              it->strand +
              it->error;
        }));
  }